

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  undefined8 *in_RSI;
  int in_EDI;
  int ret;
  Emulator emu;
  Emulator *this;
  allocator local_59;
  string local_58 [32];
  string *in_stack_ffffffffffffffc8;
  Emulator *in_stack_ffffffffffffffd0;
  int local_4;
  
  if (in_EDI < 2) {
    poVar1 = std::operator<<((ostream *)&std::cout,"USAGE: ");
    poVar1 = std::operator<<(poVar1,(char *)*in_RSI);
    poVar1 = std::operator<<(poVar1," filename.nes");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
  }
  else {
    this = (Emulator *)in_RSI[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,(char *)this,&local_59);
    Emulator::Emulator(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    local_4 = Emulator::run(in_stack_ffffffffffffffd0);
    Emulator::~Emulator(this);
  }
  return local_4;
}

Assistant:

int main(int argc, char *argv[]) {
#ifndef __EMSCRIPTEN__
    if (argc < 2) {
        std::cout << "USAGE: " << argv[0] << " filename.nes" << std::endl;
        return 1;
    }
    Emulator emu(argv[1]);
#else
    Emulator emu("game.nes");
#endif
    int ret = emu.run();
    return ret;
}